

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

void __thiscall slang::SVInt::setAllZeros(SVInt *this)

{
  bool bVar1;
  uint32_t uVar2;
  SVInt *in_RDI;
  undefined8 in_stack_ffffffffffffffd8;
  undefined1 isSigned;
  uint64_t *__s;
  undefined4 in_stack_ffffffffffffffe8;
  bitwidth_t in_stack_ffffffffffffffec;
  SVInt *in_stack_fffffffffffffff0;
  
  isSigned = (undefined1)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
  bVar1 = isSingleWord(in_RDI);
  if (bVar1) {
    (in_RDI->super_SVIntStorage).field_0.val = 0;
  }
  else if (((in_RDI->super_SVIntStorage).unknownFlag & 1U) == 0) {
    __s = (in_RDI->super_SVIntStorage).field_0.pVal;
    uVar2 = getNumWords((SVInt *)0x502ef1);
    memset(__s,0,(ulong)(uVar2 << 3));
  }
  else {
    SVInt(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,(uint64_t)in_RDI,(bool)isSigned);
    operator=((SVInt *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),in_RDI);
    ~SVInt(in_stack_fffffffffffffff0);
  }
  return;
}

Assistant:

void SVInt::setAllZeros() {
    if (isSingleWord())
        val = 0;
    else if (unknownFlag)
        *this = SVInt(bitWidth, 0, signFlag);
    else
        memset(pVal, 0, getNumWords() * WORD_SIZE);
}